

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall GlobOptBlockData::KillSymToValueMapForGeneratorYield(GlobOptBlockData *this)

{
  Sym *pSVar1;
  JitArenaAllocator *this_00;
  code *pcVar2;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  GlobHashTable *pGVar6;
  ulong uVar7;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *local_48;
  Iterator __iter;
  
  pGVar6 = this->symToValueMap;
  if (pGVar6->tableSize != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      local_48 = pGVar6->table + uVar7;
      __iter.list = local_48;
      while( true ) {
        if (__iter.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (__iter.list == local_48) break;
        pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&stack0xffffffffffffffb8);
        if (((pTVar5->element != (Value *)0x0) &&
            ((((pSVar1 = pTVar5->element->valueInfo->symStore, pSVar1 == (Sym *)0x0 ||
               (pSVar1->m_kind != SymKindStack)) || (((ulong)pSVar1[1]._vptr_Sym & 0x2000) == 0)) &&
             ((pSVar1 = pTVar5->value, pSVar1 != (Sym *)0x0 && (pSVar1->m_kind == SymKindStack))))))
           && (((ulong)pSVar1[1]._vptr_Sym & 0x2000) != 0)) {
          ValueInfo::SetSymStore(pTVar5->element->valueInfo,pSVar1);
        }
      }
      uVar7 = uVar7 + 1;
      pGVar6 = this->symToValueMap;
    } while (uVar7 < pGVar6->tableSize);
  }
  pGVar6 = this->symToValueMap;
  if (pGVar6->tableSize != 0) {
    uVar7 = 0;
    do {
      local_48 = pGVar6->table + uVar7;
      __iter.current = (NodeBase *)0x0;
      __iter.list = local_48;
      while (bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)&stack0xffffffffffffffb8), bVar3) {
        pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&stack0xffffffffffffffb8);
        buffer = __iter.list;
        if (((pTVar5->element == (Value *)0x0) ||
            (pSVar1 = pTVar5->element->valueInfo->symStore, pSVar1 == (Sym *)0x0)) ||
           ((pSVar1->m_kind != SymKindStack || (((ulong)pSVar1[1]._vptr_Sym & 0x2000) == 0)))) {
          this_00 = this->symToValueMap->alloc;
          SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
          ::UnlinkCurrentNode((EditingIterator *)&stack0xffffffffffffffb8);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     buffer,0x18);
        }
      }
      uVar7 = uVar7 + 1;
      pGVar6 = this->symToValueMap;
    } while (uVar7 < pGVar6->tableSize);
  }
  return;
}

Assistant:

void
GlobOptBlockData::KillSymToValueMapForGeneratorYield()
{
    // Remove illegal symToValueMap entries whose symstores don't have bytecode registers
    // Hash table bucket key-value visualization: { bucket.value: bucket.element }
    //
    // Idea:
    // Multiple symbols can map to the same value which has a symstore
    // (multiple keys map to same value).
    // Since the symstore might not have a bytecode register, our first pass
    // through the map attemps to use the symbol (key) as a symstore for that value.
    // This allows us to still retain such entries.
    // After the first pass, any symToValueMap entries whose symstores don't have
    // bytecode registers will be cleared.
    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, this->symToValueMap)
    {
        if (bucket.element == nullptr)
        {
            continue;
        }

        Sym* symStore = bucket.element->GetValueInfo()->GetSymStore();
        if (symStore != nullptr && symStore->IsStackSym() && symStore->AsStackSym()->HasByteCodeRegSlot())
        {
            continue;
        }

        Sym* sym = bucket.value;
        if (sym != nullptr && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
        {
            bucket.element->GetValueInfo()->SetSymStore(sym);
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    // Remove illegal entries
    FOREACH_VALUEHASHTABLE_ENTRY_EDITING(GlobHashBucket, bucket, this->symToValueMap, iter)
    {
        Value* value = bucket.element;
        if (value == nullptr)
        {
            iter.RemoveCurrent(this->symToValueMap->alloc);
        }
        else
        {
            Sym* symStore = value->GetValueInfo()->GetSymStore();
            if (symStore == nullptr || !symStore->IsStackSym() || !symStore->AsStackSym()->HasByteCodeRegSlot())
            {
                iter.RemoveCurrent(this->symToValueMap->alloc);
            }
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY_EDITING;
}